

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_WAKE(effect_handler_context_t_conflict *context)

{
  bool bVar1;
  wchar_t wVar2;
  loc_conflict grid1;
  monster_conflict *mon_00;
  source origin_00;
  wchar_t local_38;
  wchar_t dist;
  wchar_t radius;
  monster *mon;
  loc_conflict origin;
  _Bool woken;
  wchar_t i;
  effect_handler_context_t_conflict *context_local;
  
  bVar1 = false;
  origin_00._4_4_ = 0;
  origin_00.what = (context->origin).what;
  origin_00.which.trap = (context->origin).which.trap;
  grid1 = origin_get_loc(origin_00);
  for (origin.y = L'\x01'; wVar2 = cave_monster_max(cave), origin.y < wVar2;
      origin.y = origin.y + L'\x01') {
    mon_00 = cave_monster(cave,origin.y);
    if (mon_00->race != (monster_race *)0x0) {
      if (player->themed_level == '\0') {
        local_38 = (uint)z_info->max_sight << 1;
      }
      else {
        local_38 = (wchar_t)z_info->max_sight;
      }
      wVar2 = distance((loc)grid1,mon_00->grid);
      if ((wVar2 < local_38) && (mon_00->m_timed[0] != 0)) {
        monster_wake((monster *)mon_00,false,wVar2 * -2 + L'd');
        bVar1 = true;
      }
    }
  }
  if (bVar1) {
    msg("You hear a sudden stirring in the distance!");
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_WAKE(effect_handler_context_t *context)
{
	int i;
	bool woken = false;

	struct loc origin = origin_get_loc(context->origin);

	/* Wake everyone nearby */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);
		if (mon->race) {
			int radius = player->themed_level ? z_info->max_sight :
				z_info->max_sight * 2;
			int dist = distance(origin, mon->grid);

			/* Skip monsters too far away */
			if ((dist < radius) && mon->m_timed[MON_TMD_SLEEP]) {
				/* Monster wakes, closer means likelier to become aware */
				monster_wake(mon, false, 100 - 2 * dist);
				woken = true;
			}
		}
	}

	/* Messages */
	if (woken) {
		msg("You hear a sudden stirring in the distance!");
	}

	context->ident = true;

	return true;
}